

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

RealisticCamera *
pbrt::RealisticCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,Film *film,
          Medium *medium,FileLoc *loc,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_03;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  Point2i p_02;
  span<const_pbrt::Point2<float>_> vert_00;
  span<const_pbrt::Point2<float>_> vert_01;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  float *pfVar5;
  Tuple2<pbrt::Point2,_float> *pTVar6;
  Point2i PVar7;
  string *this;
  Image *in_R9;
  Float FVar8;
  float fVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar11;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int x_4;
  int y_4;
  Float scale;
  Float avg_1;
  int x_3;
  int y_3;
  Float sum;
  Float avg;
  int x_2;
  int y_2;
  Image mono;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata im;
  Float r;
  int i_1;
  array<pbrt::Point2<float>,_10> vert_1;
  int i;
  Point2f vert [5];
  Float s2;
  Float s1;
  Float c2;
  Float c1;
  int x_1;
  int y_1;
  Float v;
  Float sigma2;
  Float r2;
  Point2f uv;
  int x;
  int y;
  Image apertureImage;
  string apertureName;
  anon_class_16_2_5a488c63 rasterize;
  int builtinRes;
  vector<float,_std::allocator<float>_> lensParameters;
  Float focusDistance;
  Float apertureDiameter;
  string lensFile;
  CameraBaseParameters cameraBaseParameters;
  Image *in_stack_ffffffffffffed98;
  ImageAndMetadata *in_stack_ffffffffffffeda0;
  undefined4 in_stack_ffffffffffffeda8;
  WrapMode in_stack_ffffffffffffedac;
  Float in_stack_ffffffffffffedb0;
  int in_stack_ffffffffffffedb4;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffedb8;
  undefined4 in_stack_ffffffffffffedc0;
  int in_stack_ffffffffffffedc4;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  int in_stack_ffffffffffffedd4;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  float in_stack_ffffffffffffede4;
  string *in_stack_ffffffffffffede8;
  Float in_stack_ffffffffffffedf0;
  int in_stack_ffffffffffffedf4;
  ParameterDictionary *in_stack_ffffffffffffedf8;
  Float in_stack_ffffffffffffee10;
  int in_stack_ffffffffffffee14;
  Image *in_stack_ffffffffffffee18;
  int in_stack_ffffffffffffee20;
  WrapMode in_stack_ffffffffffffee24;
  WrapMode in_stack_ffffffffffffee28;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffee2c;
  FileLoc *in_stack_ffffffffffffee38;
  undefined4 in_stack_ffffffffffffee40;
  undefined4 in_stack_ffffffffffffee44;
  int iVar17;
  Medium *in_stack_ffffffffffffee48;
  undefined4 in_stack_ffffffffffffee50;
  undefined4 in_stack_ffffffffffffee54;
  CameraTransform *in_stack_ffffffffffffee58;
  CameraBaseParameters *in_stack_ffffffffffffee60;
  string *local_1190;
  Image *in_stack_ffffffffffffee78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee80;
  string *in_stack_ffffffffffffee88;
  string *in_stack_ffffffffffffeea8;
  ColorEncoding *in_stack_ffffffffffffeec0;
  Image *this_00;
  undefined8 in_stack_ffffffffffffeec8;
  PixelFormat PVar19;
  Image *pIVar18;
  Image *in_stack_ffffffffffffeed0;
  Image *this_01;
  Allocator in_stack_ffffffffffffeed8;
  Allocator AVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  size_t in_stack_ffffffffffffeee8;
  undefined1 *puVar22;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffeef0;
  Tuple2<pbrt::Point2,_int> resolution;
  Image *this_02;
  array<pbrt::WrapMode,_2> wrapMode_01;
  int in_stack_ffffffffffffef08;
  float local_10b4;
  anon_class_16_2_5a488c63 *in_stack_ffffffffffffef98;
  Point2<float> *in_stack_ffffffffffffefa0;
  string *psVar23;
  size_t in_stack_ffffffffffffefa8;
  string *local_fa8;
  int local_edc;
  int local_ed4;
  int iStack_ecc;
  int local_ec8;
  int local_eb8;
  int local_e9c;
  int local_e94;
  int iStack_e8c;
  int local_e88;
  float local_e84;
  int local_e30;
  int local_e28;
  int iStack_e20;
  int local_e1c;
  allocator<char> local_e01;
  string *local_e00;
  string local_df8 [32];
  string *local_dd8;
  undefined8 local_dd0;
  Tuple2<pbrt::Point2,_int> local_db8;
  Image local_db0;
  undefined1 local_d14;
  undefined1 local_d13 [2];
  allocator<char> local_d11;
  Image *local_d10;
  undefined1 local_d08 [104];
  size_t local_ca0;
  Image *local_c50;
  string local_c48 [32];
  string local_c28 [656];
  Tuple2<pbrt::Point2,_float> local_998;
  float local_990;
  uint local_98c;
  array<pbrt::Point2<float>,_10> local_988 [3];
  int local_88c;
  Tuple2<pbrt::Point2,float> local_888 [48];
  float local_858;
  float local_854;
  float local_850;
  float local_84c;
  int local_840;
  int local_83c;
  Image *local_838;
  undefined1 local_822;
  allocator<char> local_821;
  string *local_820;
  string local_818 [16];
  ColorEncoding *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff800;
  Allocator in_stack_fffffffffffff808;
  float local_72c;
  float local_728;
  float local_724;
  float local_720;
  float local_71c;
  Tuple2<pbrt::Point2,_int> local_718;
  Tuple2<pbrt::Point2,_int> local_710;
  float local_708;
  float local_704;
  Tuple2<pbrt::Point2,_int> local_700;
  int local_6f8;
  Tuple2<pbrt::Point2,_int> local_6f4;
  int local_6ec;
  Image *local_6e8;
  undefined1 local_6d2;
  allocator<char> local_6d1;
  string *local_6d0;
  string local_6c8 [32];
  string *local_6a8;
  undefined8 local_6a0;
  Image *local_5e8;
  Image local_5e0;
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [32];
  string local_4f8 [32];
  int *local_4d8;
  Image **local_4d0;
  int local_4c8;
  undefined4 local_4c4;
  string local_4c0 [32];
  vector<float,_std::allocator<float>_> local_4a0;
  undefined4 local_488;
  allocator<char> local_481;
  string local_480 [32];
  Float local_460;
  allocator<char> local_459;
  string local_458 [32];
  Float local_438;
  allocator<char> local_431;
  string local_430 [55];
  allocator<char> local_3f9;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [936];
  Image *local_10;
  RealisticCamera *local_8;
  
  PVar19 = (PixelFormat)((ulong)in_stack_ffffffffffffeec8 >> 0x20);
  local_10 = in_R9;
  Film::Film((Film *)in_stack_ffffffffffffeda0,(Film *)in_stack_ffffffffffffed98);
  Medium::Medium((Medium *)in_stack_ffffffffffffeda0,(Medium *)in_stack_ffffffffffffed98);
  CameraBaseParameters::CameraBaseParameters
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             (Film *)CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
             in_stack_ffffffffffffee48,
             (ParameterDictionary *)CONCAT44(in_stack_ffffffffffffee44,in_stack_ffffffffffffee40),
             in_stack_ffffffffffffee38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             (char *)in_stack_ffffffffffffedd8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             (char *)in_stack_ffffffffffffedd8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
  ParameterDictionary::GetOneString
            (in_stack_ffffffffffffedf8,
             (string *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0),
             in_stack_ffffffffffffede8);
  ResolveFilename(in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             (char *)in_stack_ffffffffffffedd8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_ffffffffffffeda0,
                     (string *)in_stack_ffffffffffffed98,0.0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  local_438 = FVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
             (char *)in_stack_ffffffffffffedd8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_ffffffffffffeda0,
                     (string *)in_stack_ffffffffffffed98,0.0);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  local_460 = FVar8;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string(local_4c0,local_3b8);
    ReadFloatFile(in_stack_ffffffffffffeea8);
    std::__cxx11::string::~string(local_4c0);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0));
    if (bVar1) {
      Error<std::__cxx11::string&>
                ((FileLoc *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                 (char *)in_stack_ffffffffffffedd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
      local_8 = (RealisticCamera *)0x0;
      local_488 = 1;
    }
    else {
      sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_4a0);
      if ((sVar4 & 3) == 0) {
        local_4c8 = 0x100;
        local_4d8 = &local_4c8;
        local_4d0 = &local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                   (char *)in_stack_ffffffffffffedd8,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                   (char *)in_stack_ffffffffffffedd8,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0))
        ;
        ParameterDictionary::GetOneString
                  (in_stack_ffffffffffffedf8,
                   (string *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0),
                   in_stack_ffffffffffffede8);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator(&local_541);
        std::__cxx11::string::~string(local_518);
        std::allocator<char>::~allocator(&local_519);
        local_5e8 = local_10;
        AVar20.memoryResource._4_4_ = in_stack_ffffffffffffee24;
        AVar20.memoryResource._0_4_ = in_stack_ffffffffffffee20;
        Image::Image(in_stack_ffffffffffffee18,AVar20);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98);
          if (bVar1) {
            Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                (int)in_stack_ffffffffffffed98);
            local_6d2 = 1;
            local_6d0 = local_6c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                       (char *)in_stack_ffffffffffffedd8,
                       (allocator<char> *)
                       CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
            local_6d2 = 0;
            local_6a8 = local_6c8;
            local_6a0 = 1;
            v_00._M_array._4_4_ = in_stack_ffffffffffffedac;
            v_00._M_array._0_4_ = in_stack_ffffffffffffeda8;
            v_00._M_len._0_4_ = in_stack_ffffffffffffedb0;
            v_00._M_len._4_4_ = in_stack_ffffffffffffedb4;
            pstd::
            span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffeda0,v_00);
            ColorEncoding::TaggedPointer
                      ((ColorEncoding *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
            local_6e8 = local_10;
            channels.n = in_stack_ffffffffffffeee8;
            channels.ptr = in_stack_ffffffffffffeee0;
            Image::Image(in_stack_ffffffffffffeed0,PVar19,(Point2i)in_stack_ffffffffffffeef0,
                         channels,in_stack_ffffffffffffeec0,in_stack_ffffffffffffeed8);
            Image::operator=(&in_stack_ffffffffffffeda0->image,local_10);
            Image::~Image(&in_stack_ffffffffffffeda0->image);
            local_fa8 = (string *)&local_6a8;
            in_stack_ffffffffffffed98 = local_10;
            do {
              local_fa8 = local_fa8 + -0x20;
              std::__cxx11::string::~string(local_fa8);
            } while (local_fa8 != local_6c8);
            std::allocator<char>::~allocator(&local_6d1);
            local_6ec = 0;
            while( true ) {
              iVar2 = local_6ec;
              local_6f4 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
              if (local_6f4.y <= iVar2) break;
              local_6f8 = 0;
              while( true ) {
                iVar2 = local_6f8;
                local_700 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
                if (local_700.x <= iVar2) break;
                local_710 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
                local_718 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                fVar9 = Sqr<float>(local_708);
                local_71c = Sqr<float>(local_704);
                local_71c = fVar9 + local_71c;
                local_720 = 1.0;
                local_728 = 0.0;
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = &DAT_8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar12._0_4_ = SUB164(ZEXT416((uint)local_71c) ^ auVar16,0) / 1.0;
                auVar12._4_12_ = SUB1612(ZEXT416((uint)local_71c) ^ auVar16,4);
                dVar10 = std::exp(auVar12._0_8_);
                auVar13._0_4_ = -1.0 / local_720;
                auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
                dVar11 = std::exp(auVar13._0_8_);
                local_72c = SUB84(dVar10,0) - SUB84(dVar11,0);
                pfVar5 = std::max<float>(&local_728,&local_72c);
                local_724 = *pfVar5;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                    (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                    (int)in_stack_ffffffffffffed98);
                PVar7.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee24;
                PVar7.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee20;
                Image::SetChannel(in_stack_ffffffffffffee18,PVar7,in_stack_ffffffffffffee14,
                                  in_stack_ffffffffffffee10);
                local_6f8 = local_6f8 + 1;
              }
              local_6ec = local_6ec + 1;
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98);
            if (bVar1) {
              Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                  (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                  (int)in_stack_ffffffffffffed98);
              local_822 = 1;
              local_820 = local_818;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                         (char *)in_stack_ffffffffffffedd8,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
              local_822 = 0;
              v_01._M_array._4_4_ = in_stack_ffffffffffffedac;
              v_01._M_array._0_4_ = in_stack_ffffffffffffeda8;
              v_01._M_len._0_4_ = in_stack_ffffffffffffedb0;
              v_01._M_len._4_4_ = in_stack_ffffffffffffedb4;
              pstd::
              span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffeda0,v_01);
              ColorEncoding::TaggedPointer
                        ((ColorEncoding *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
              local_838 = local_10;
              channels_00.n = in_stack_ffffffffffffeee8;
              channels_00.ptr = in_stack_ffffffffffffeee0;
              Image::Image(in_stack_ffffffffffffeed0,PVar19,(Point2i)in_stack_ffffffffffffeef0,
                           channels_00,in_stack_ffffffffffffeec0,in_stack_ffffffffffffeed8);
              Image::operator=(&in_stack_ffffffffffffeda0->image,local_10);
              Image::~Image(&in_stack_ffffffffffffeda0->image);
              psVar23 = local_818;
              this = (string *)&stack0xfffffffffffff808;
              in_stack_ffffffffffffed98 = local_10;
              do {
                this = this + -0x20;
                std::__cxx11::string::~string(this);
              } while (this != psVar23);
              std::allocator<char>::~allocator(&local_821);
              for (local_83c = (int)((double)local_4c8 * 0.25);
                  (double)local_83c < (double)local_4c8 * 0.75; local_83c = local_83c + 1) {
                for (local_840 = (int)((double)local_4c8 * 0.25);
                    (double)local_840 < (double)local_4c8 * 0.75; local_840 = local_840 + 1) {
                  Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                      (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                      (int)in_stack_ffffffffffffed98);
                  p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee24;
                  p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee20;
                  Image::SetChannel(in_stack_ffffffffffffee18,p,in_stack_ffffffffffffee14,
                                    in_stack_ffffffffffffee10);
                }
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98
                                     );
              if (bVar1) {
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                local_84c = (SUB84(dVar10,0) + -1.0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                local_850 = (SUB84(dVar10,0) + 1.0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                dVar10 = std::sqrt((double)(ulong)(uint)(SUB84(dVar10,0) + SUB84(dVar10,0) + 10.0));
                local_854 = SUB84(dVar10,0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                dVar10 = std::sqrt((double)(ulong)(uint)(10.0 - (SUB84(dVar10,0) + SUB84(dVar10,0)))
                                  );
                local_858 = SUB84(dVar10,0) * 0.25;
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffeda0,
                           (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                           SUB84(in_stack_ffffffffffffed98,0));
                for (local_88c = 0; local_88c < 5; local_88c = local_88c + 1) {
                  Tuple2<pbrt::Point2,float>::operator*=(local_888 + (long)local_88c * 8,0.8);
                }
                pstd::span<pbrt::Point2<float>const>::span<5ul>
                          ((span<const_pbrt::Point2<float>_> *)in_stack_ffffffffffffeda0,
                           (Point2<float> (*) [5])in_stack_ffffffffffffed98);
                vert_00.n = in_stack_ffffffffffffefa8;
                vert_00.ptr = in_stack_ffffffffffffefa0;
                Create::anon_class_16_2_5a488c63::operator()(in_stack_ffffffffffffef98,vert_00);
                Image::operator=(&in_stack_ffffffffffffeda0->image,in_stack_ffffffffffffed98);
                Image::~Image(&in_stack_ffffffffffffeda0->image);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffeda0,
                                        (char *)in_stack_ffffffffffffed98);
                if (bVar1) {
                  pstd::array<pbrt::Point2<float>,_10>::array
                            ((array<pbrt::Point2<float>,_10> *)
                             CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0));
                  for (local_98c = 0; (int)local_98c < 10; local_98c = local_98c + 1) {
                    if ((local_98c & 1) == 0) {
                      FVar8 = Radians(72.0);
                      dVar10 = std::cos((double)(ulong)(uint)FVar8);
                      FVar8 = Radians(36.0);
                      dVar11 = std::cos((double)(ulong)(uint)FVar8);
                      local_10b4 = SUB84(dVar10,0) / SUB84(dVar11,0);
                    }
                    else {
                      local_10b4 = 1.0;
                    }
                    local_990 = local_10b4;
                    auVar14._0_4_ = ((float)(int)local_98c * 3.1415927) / 5.0;
                    auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    std::cos(auVar14._0_8_);
                    auVar15._0_4_ = ((float)(int)local_98c * 3.1415927) / 5.0;
                    auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    std::sin(auVar15._0_8_);
                    Point2<float>::Point2
                              ((Point2<float> *)in_stack_ffffffffffffeda0,
                               (float)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                               SUB84(in_stack_ffffffffffffed98,0));
                    pTVar6 = &pstd::array<pbrt::Point2<float>,_10>::operator[]
                                        (local_988,(long)(int)local_98c)->
                              super_Tuple2<pbrt::Point2,_float>;
                    *pTVar6 = local_998;
                  }
                  pstd::array<pbrt::Point2<float>,_10>::begin(local_988);
                  pstd::array<pbrt::Point2<float>,_10>::end(local_988);
                  std::reverse<pbrt::Point2<float>*>
                            ((Point2<float> *)
                             CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                             (Point2<float> *)
                             CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
                  pstd::span<pbrt::Point2<float>const>::
                  span<pstd::array<pbrt::Point2<float>,10>,void,pstd::array<pbrt::Point2<float>,10>>
                            ((span<const_pbrt::Point2<float>_> *)
                             CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                             (array<pbrt::Point2<float>,_10> *)
                             CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
                  vert_01.n = in_stack_ffffffffffffefa8;
                  vert_01.ptr = in_stack_ffffffffffffefa0;
                  Create::anon_class_16_2_5a488c63::operator()(in_stack_ffffffffffffef98,vert_01);
                  Image::operator=(&in_stack_ffffffffffffeda0->image,in_stack_ffffffffffffed98);
                  Image::~Image(&in_stack_ffffffffffffeda0->image);
                }
                else {
                  std::__cxx11::string::string(local_c48,local_4f8);
                  ResolveFilename(in_stack_ffffffffffffee88);
                  local_c50 = local_10;
                  ColorEncoding::TaggedPointer
                            ((ColorEncoding *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
                  Image::Read(in_stack_fffffffffffff800,in_stack_fffffffffffff808,
                              in_stack_fffffffffffff7f8);
                  std::__cxx11::string::~string(local_c28);
                  std::__cxx11::string::~string(local_c48);
                  Image::operator=(&in_stack_ffffffffffffeda0->image,in_stack_ffffffffffffed98);
                  iVar2 = Image::NChannels((Image *)0x850856);
                  if (1 < iVar2) {
                    local_d14 = 1;
                    this_02 = (Image *)local_d08;
                    wrapMode_01.values = (WrapMode  [2])&local_d11;
                    local_d10 = this_02;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                               (char *)in_stack_ffffffffffffedd8,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
                    puVar22 = local_d08 + 0x20;
                    resolution = (Tuple2<pbrt::Point2,_int>)((long)local_d13 + 1);
                    local_d10 = (Image *)puVar22;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                               (char *)in_stack_ffffffffffffedd8,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
                    AVar20.memoryResource = (memory_resource *)(local_d08 + 0x40);
                    pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d13;
                    local_d10 = (Image *)AVar20.memoryResource;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                               (char *)in_stack_ffffffffffffedd8,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
                    local_d14 = 0;
                    local_d08._96_8_ = local_d08;
                    local_ca0 = 3;
                    v_02._M_array._4_4_ = in_stack_ffffffffffffedac;
                    v_02._M_array._0_4_ = in_stack_ffffffffffffeda8;
                    v_02._M_len._0_4_ = in_stack_ffffffffffffedb0;
                    v_02._M_len._4_4_ = in_stack_ffffffffffffedb4;
                    pstd::
                    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffeda0,v_02);
                    requestedChannels.n = (size_t)in_stack_ffffffffffffee88;
                    requestedChannels.ptr = in_stack_ffffffffffffee80;
                    Image::GetChannelDesc(in_stack_ffffffffffffee78,requestedChannels);
                    pIVar18 = (Image *)local_d08;
                    this_00 = (Image *)(local_d08 + 0x60);
                    do {
                      this_00 = (Image *)&this_00[-1].p32;
                      std::__cxx11::string::~string((string *)this_00);
                    } while (this_00 != pIVar18);
                    this_01 = this_00;
                    std::allocator<char>::~allocator((allocator<char> *)local_d13);
                    PVar19 = (PixelFormat)((ulong)pIVar18 >> 0x20);
                    std::allocator<char>::~allocator((allocator<char> *)(local_d13 + 1));
                    std::allocator<char>::~allocator(&local_d11);
                    bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x850a48);
                    if (!bVar1) {
                      ErrorExit<std::__cxx11::string&>
                                ((char *)CONCAT44(in_stack_ffffffffffffedd4,
                                                  in_stack_ffffffffffffedd0),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffedc8);
                    }
                    local_db8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
                    local_e00 = local_df8;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                               (char *)in_stack_ffffffffffffedd8,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
                    local_dd8 = local_df8;
                    local_dd0 = 1;
                    v_03._M_array._4_4_ = in_stack_ffffffffffffedac;
                    v_03._M_array._0_4_ = in_stack_ffffffffffffeda8;
                    v_03._M_len._0_4_ = in_stack_ffffffffffffedb0;
                    v_03._M_len._4_4_ = in_stack_ffffffffffffedb4;
                    pstd::
                    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffeda0,v_03);
                    ColorEncoding::TaggedPointer
                              ((ColorEncoding *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98)
                    ;
                    channels_01.n = (size_t)puVar22;
                    channels_01.ptr = pbVar21;
                    Image::Image(this_01,PVar19,(Point2i)resolution,channels_01,
                                 (ColorEncoding *)this_00,AVar20);
                    local_1190 = (string *)&local_dd8;
                    in_stack_ffffffffffffed98 = local_10;
                    do {
                      local_1190 = local_1190 + -0x20;
                      std::__cxx11::string::~string(local_1190);
                    } while (local_1190 != local_df8);
                    std::allocator<char>::~allocator(&local_e01);
                    local_e1c = 0;
                    while( true ) {
                      iVar17 = local_e1c;
                      PVar7 = Image::Resolution(&local_db0);
                      iStack_e20 = PVar7.super_Tuple2<pbrt::Point2,_int>.y;
                      if (iStack_e20 <= iVar17) break;
                      local_e28 = 0;
                      while( true ) {
                        iVar17 = local_e28;
                        PVar7 = Image::Resolution(&local_db0);
                        local_e30 = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
                        if (local_e30 <= iVar17) break;
                        Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                            (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                            (int)in_stack_ffffffffffffed98);
                        WrapMode2D::WrapMode2D
                                  ((WrapMode2D *)
                                   CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                                   in_stack_ffffffffffffedac);
                        p_02.super_Tuple2<pbrt::Point2,_int>.y = iVar2;
                        p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffef08;
                        Image::GetChannels(this_02,p_02,(ImageChannelDesc *)resolution,
                                           (WrapMode2D)wrapMode_01.values);
                        ImageChannelValues::Average
                                  ((ImageChannelValues *)
                                   CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0));
                        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x850ede);
                        Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                            (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                            (int)in_stack_ffffffffffffed98);
                        p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee24;
                        p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee20;
                        Image::SetChannel(in_stack_ffffffffffffee18,p_00,in_stack_ffffffffffffee14,
                                          in_stack_ffffffffffffee10);
                        local_e28 = local_e28 + 1;
                      }
                      local_e1c = local_e1c + 1;
                    }
                    Image::operator=(&in_stack_ffffffffffffeda0->image,in_stack_ffffffffffffed98);
                    Image::~Image(&in_stack_ffffffffffffeda0->image);
                    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8510ba);
                  }
                  ImageAndMetadata::~ImageAndMetadata(in_stack_ffffffffffffeda0);
                }
              }
            }
          }
          bVar1 = Image::operator_cast_to_bool(&local_5e0);
          iVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffee14);
          if (bVar1) {
            Image::FlipY((Image *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0));
            local_e84 = 0.0;
            local_e88 = 0;
            while( true ) {
              PVar7 = Image::Resolution(&local_5e0);
              iStack_e8c = PVar7.super_Tuple2<pbrt::Point2,_int>.y;
              if (iStack_e8c <= local_e88) break;
              local_e94 = 0;
              while( true ) {
                in_stack_ffffffffffffedf4 = local_e94;
                PVar7 = Image::Resolution(&local_5e0);
                local_e9c = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
                if (local_e9c <= in_stack_ffffffffffffedf4) break;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                    (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                    (int)in_stack_ffffffffffffed98);
                WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                           in_stack_ffffffffffffedac);
                wrapMode.wrap.values[1] = in_stack_ffffffffffffee28;
                wrapMode.wrap.values[0] = in_stack_ffffffffffffee24;
                in_stack_ffffffffffffedf0 =
                     Image::GetChannel(in_stack_ffffffffffffee18,(Point2i)in_stack_ffffffffffffee2c,
                                       iVar2,wrapMode);
                local_e84 = in_stack_ffffffffffffedf0 + local_e84;
                local_e94 = local_e94 + 1;
              }
              local_e88 = local_e88 + 1;
            }
            PVar7 = Image::Resolution(&local_5e0);
            local_eb8 = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
            in_stack_ffffffffffffedd8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
            local_ec8 = 0;
            while( true ) {
              in_stack_ffffffffffffedc4 = local_ec8;
              in_stack_ffffffffffffedc8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0);
              iStack_ecc = in_stack_ffffffffffffedc8.y;
              in_stack_ffffffffffffedd4 = local_eb8;
              in_stack_ffffffffffffede4 = local_e84;
              if (iStack_ecc <= in_stack_ffffffffffffedc4) break;
              local_ed4 = 0;
              while( true ) {
                in_stack_ffffffffffffedb4 = local_ed4;
                in_stack_ffffffffffffedb8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_5e0)
                ;
                local_edc = in_stack_ffffffffffffedb8.x;
                if (local_edc <= in_stack_ffffffffffffedb4) break;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                    (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                    (int)in_stack_ffffffffffffed98);
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffeda0,
                                    (int)((ulong)in_stack_ffffffffffffed98 >> 0x20),
                                    (int)in_stack_ffffffffffffed98);
                WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                           in_stack_ffffffffffffedac);
                wrapMode_00.wrap.values[1] = in_stack_ffffffffffffee28;
                wrapMode_00.wrap.values[0] = in_stack_ffffffffffffee24;
                in_stack_ffffffffffffedb0 =
                     Image::GetChannel(in_stack_ffffffffffffee18,(Point2i)in_stack_ffffffffffffee2c,
                                       iVar2,wrapMode_00);
                p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee24;
                p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee20;
                Image::SetChannel(in_stack_ffffffffffffee18,p_01,iVar2,in_stack_ffffffffffffee10);
                local_ed4 = local_ed4 + 1;
              }
              local_ec8 = local_ec8 + 1;
            }
          }
        }
        local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
                            ((polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                             (CameraBaseParameters *)in_stack_ffffffffffffedd8,
                             (vector<float,_std::allocator<float>_> *)
                             CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                             (float *)in_stack_ffffffffffffedc8,
                             (float *)CONCAT44(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0),
                             (Image *)in_stack_ffffffffffffedb8,
                             (polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0));
        local_488 = 1;
        Image::~Image(&in_stack_ffffffffffffeda0->image);
        std::__cxx11::string::~string(local_4f8);
      }
      else {
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_4a0);
        local_4c4 = (undefined4)sVar4;
        Error<std::__cxx11::string&,int>
                  ((FileLoc *)CONCAT44(in_stack_ffffffffffffedf4,in_stack_ffffffffffffedf0),
                   (char *)in_stack_ffffffffffffede8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                   (int *)in_stack_ffffffffffffedd8);
        local_8 = (RealisticCamera *)0x0;
        local_488 = 1;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0));
  }
  else {
    Error((FileLoc *)in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98);
    local_8 = (RealisticCamera *)0x0;
    local_488 = 1;
  }
  std::__cxx11::string::~string(local_3b8);
  return local_8;
}

Assistant:

RealisticCamera *RealisticCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         Film film, Medium medium, const FileLoc *loc,
                                         Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    // Realistic camera-specific parameters
    std::string lensFile = ResolveFilename(parameters.GetOneString("lensfile", ""));
    Float apertureDiameter = parameters.GetOneFloat("aperturediameter", 1.0);
    Float focusDistance = parameters.GetOneFloat("focusdistance", 10.0);

    if (lensFile.empty()) {
        Error(loc, "No lens description file supplied!");
        return nullptr;
    }
    // Load element data from lens description file
    std::vector<Float> lensParameters = ReadFloatFile(lensFile);
    if (lensParameters.empty()) {
        Error(loc, "Error reading lens specification file \"%s\".", lensFile);
        return nullptr;
    }
    if (lensParameters.size() % 4 != 0) {
        Error(loc,
              "%s: excess values in lens specification file; "
              "must be multiple-of-four values, read %d.",
              lensFile, (int)lensParameters.size());
        return nullptr;
    }

    int builtinRes = 256;
    auto rasterize = [&](pstd::span<const Point2f> vert) {
        Image image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"}, nullptr, alloc);

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Point2f p(-1 + 2 * (x + 0.5f) / image.Resolution().x,
                          -1 + 2 * (y + 0.5f) / image.Resolution().y);
                int windingNumber = 0;
                // Test against edges
                for (int i = 0; i < vert.size(); ++i) {
                    int i1 = (i + 1) % vert.size();
                    Float e = (p[0] - vert[i][0]) * (vert[i1][1] - vert[i][1]) -
                              (p[1] - vert[i][1]) * (vert[i1][0] - vert[i][0]);
                    if (vert[i].y <= p.y) {
                        if (vert[i1].y > p.y && e > 0)
                            ++windingNumber;
                    } else if (vert[i1].y <= p.y && e < 0)
                        --windingNumber;
                }

                image.SetChannel({x, y}, 0, windingNumber == 0 ? 0.f : 1.f);
            }

        return image;
    };

    std::string apertureName = parameters.GetOneString("aperture", "");
    Image apertureImage(alloc);
    if (!apertureName.empty()) {
        // built-in diaphragm shapes
        if (apertureName == "gaussian") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x) {
                    Point2f uv(-1 + 2 * (x + 0.5f) / apertureImage.Resolution().x,
                               -1 + 2 * (y + 0.5f) / apertureImage.Resolution().y);
                    Float r2 = Sqr(uv.x) + Sqr(uv.y);
                    Float sigma2 = 1;
                    Float v = std::max<Float>(
                        0, std::exp(-r2 / sigma2) - std::exp(-1 / sigma2));
                    apertureImage.SetChannel({x, y}, 0, v);
                }
        } else if (apertureName == "square") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = .25 * builtinRes; y < .75 * builtinRes; ++y)
                for (int x = .25 * builtinRes; x < .75 * builtinRes; ++x)
                    apertureImage.SetChannel({x, y}, 0, 4.f);
        } else if (apertureName == "pentagon") {
            // https://mathworld.wolfram.com/RegularPentagon.html
            Float c1 = (std::sqrt(5.f) - 1) / 4;
            Float c2 = (std::sqrt(5.f) + 1) / 4;
            Float s1 = std::sqrt(10.f + 2.f * std::sqrt(5.f)) / 4;
            Float s2 = std::sqrt(10.f - 2.f * std::sqrt(5.f)) / 4;
            // Vertices in CW order.
            Point2f vert[5] = {Point2f(0, 1), {s1, c1}, {s2, -c2}, {-s2, -c2}, {-s1, c1}};
            // Scale down slightly
            for (int i = 0; i < 5; ++i)
                vert[i] *= .8f;
            apertureImage = rasterize(vert);
        } else if (apertureName == "star") {
            // 5-sided. Vertices are two pentagons--inner and outer radius
            pstd::array<Point2f, 10> vert;
            for (int i = 0; i < 10; ++i) {
                // inner radius: https://math.stackexchange.com/a/2136996
                Float r =
                    (i & 1) ? 1.f : (std::cos(Radians(72.f)) / std::cos(Radians(36.f)));
                vert[i] = Point2f(r * std::cos(Pi * i / 5.f), r * std::sin(Pi * i / 5.f));
            }
            std::reverse(vert.begin(), vert.end());
            apertureImage = rasterize(vert);
        } else {
            ImageAndMetadata im = Image::Read(ResolveFilename(apertureName), alloc);
            apertureImage = std::move(im.image);
            if (apertureImage.NChannels() > 1) {
                ImageChannelDesc rgbDesc = apertureImage.GetChannelDesc({"R", "G", "B"});
                if (!rgbDesc)
                    ErrorExit("%s: didn't find R, G, B channels to average for "
                              "aperture image.",
                              apertureName);

                Image mono(PixelFormat::Float, apertureImage.Resolution(), {"Y"}, nullptr,
                           alloc);
                for (int y = 0; y < mono.Resolution().y; ++y)
                    for (int x = 0; x < mono.Resolution().x; ++x) {
                        Float avg = apertureImage.GetChannels({x, y}, rgbDesc).Average();
                        mono.SetChannel({x, y}, 0, avg);
                    }

                apertureImage = std::move(mono);
            }
        }

        if (apertureImage) {
            apertureImage.FlipY();

            // Normalize it so that brightness matches a circular aperture
            Float sum = 0;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    sum += apertureImage.GetChannel({x, y}, 0);
            Float avg =
                sum / (apertureImage.Resolution().x * apertureImage.Resolution().y);

            Float scale = (Pi / 4) / avg;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0,
                                             apertureImage.GetChannel({x, y}, 0) * scale);
        }
    }

    return alloc.new_object<RealisticCamera>(cameraBaseParameters, lensParameters,
                                             focusDistance, apertureDiameter,
                                             std::move(apertureImage), alloc);
}